

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Token * __thiscall Parser::compareOp(Token *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  Tokenizer::getToken(__return_storage_ptr__,this->tokenizer);
  bVar1 = Token::isComparisonOperator(__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Parser::compareOp",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Expected comparison operator, instead got",&local_52);
  die(this,&local_30,&local_50,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Token::~Token(__return_storage_ptr__);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Token Parser::compareOp() {
    // comp_op:  < > == >= <= <> !=

    Token compOp = tokenizer.getToken();
    if(!compOp.isComparisonOperator())
        die("Parser::compareOp", "Expected comparison operator, instead got", compOp);
    return compOp;
}